

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * tinyxml2::XMLUtil::GetCharacterRef(char *p,char *value,int *length)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  byte *pbVar4;
  int iVar5;
  char cVar6;
  uint uVar7;
  unsigned_long input;
  long lVar8;
  bool bVar9;
  
  *length = 0;
  if (p[1] != '#') {
    return p + 1;
  }
  if (p[2] == '\0') {
    return p + 1;
  }
  if (p[2] == 'x') {
    if ((p[3] != '\0') && (pcVar3 = strchr(p + 3,0x3b), pcVar3 != (char *)0x0)) {
      lVar8 = (long)pcVar3 - (long)p;
      pbVar4 = (byte *)(pcVar3 + -1);
      iVar5 = 1;
      input = 0;
      do {
        bVar1 = *pbVar4;
        bVar9 = bVar1 == 0x78;
        if (bVar9) break;
        uVar7 = (uint)bVar1;
        if ((byte)(bVar1 - 0x30) < 10) {
          uVar7 = uVar7 - 0x30 & 0xff;
LAB_001667e9:
          input = input + uVar7 * iVar5;
          iVar5 = iVar5 << 4;
          pbVar4 = pbVar4 + -1;
          bVar2 = true;
        }
        else {
          if ((byte)(bVar1 + 0x9f) < 6) {
            uVar7 = uVar7 - 0x57;
            goto LAB_001667e9;
          }
          if ((byte)(bVar1 + 0xbf) < 6) {
            uVar7 = uVar7 - 0x37;
            goto LAB_001667e9;
          }
          bVar2 = false;
        }
      } while (bVar2);
      goto LAB_00166831;
    }
LAB_0016682a:
    bVar9 = false;
    lVar8 = 0;
  }
  else {
    pcVar3 = strchr(p + 2,0x3b);
    if (pcVar3 == (char *)0x0) goto LAB_0016682a;
    lVar8 = (long)pcVar3 - (long)p;
    cVar6 = pcVar3[-1];
    if (cVar6 != '#') {
      pcVar3 = pcVar3 + -2;
      iVar5 = 1;
      input = 0;
      do {
        bVar9 = (byte)(cVar6 - 0x30U) < 10;
        if (!bVar9) break;
        input = input + (uint)(byte)(cVar6 - 0x30U) * iVar5;
        iVar5 = iVar5 * 10;
        cVar6 = *pcVar3;
        pcVar3 = pcVar3 + -1;
      } while (cVar6 != '#');
      goto LAB_00166831;
    }
    bVar9 = true;
  }
  input = 0;
LAB_00166831:
  if (bVar9) {
    ConvertUTF32ToUTF8(input,value,length);
    pcVar3 = p + lVar8 + 1;
  }
  else {
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

const char* XMLUtil::GetCharacterRef( const char* p, char* value, int* length )
{
    // Presume an entity, and pull it out.
    *length = 0;

    if ( *(p+1) == '#' && *(p+2) ) {
        unsigned long ucs = 0;
        TIXMLASSERT( sizeof( ucs ) >= 4 );
        ptrdiff_t delta = 0;
        unsigned mult = 1;
        static const char SEMICOLON = ';';

        if ( *(p+2) == 'x' ) {
            // Hexadecimal.
            const char* q = p+3;
            if ( !(*q) ) {
                return 0;
            }

            q = strchr( q, SEMICOLON );

            if ( !q ) {
                return 0;
            }
            TIXMLASSERT( *q == SEMICOLON );

            delta = q-p;
            --q;

            while ( *q != 'x' ) {
                unsigned int digit = 0;

                if ( *q >= '0' && *q <= '9' ) {
                    digit = *q - '0';
                }
                else if ( *q >= 'a' && *q <= 'f' ) {
                    digit = *q - 'a' + 10;
                }
                else if ( *q >= 'A' && *q <= 'F' ) {
                    digit = *q - 'A' + 10;
                }
                else {
                    return 0;
                }
                TIXMLASSERT( digit < 16 );
                TIXMLASSERT( digit == 0 || mult <= UINT_MAX / digit );
                const unsigned int digitScaled = mult * digit;
                TIXMLASSERT( ucs <= ULONG_MAX - digitScaled );
                ucs += digitScaled;
                TIXMLASSERT( mult <= UINT_MAX / 16 );
                mult *= 16;
                --q;
            }
        }
        else {
            // Decimal.
            const char* q = p+2;
            if ( !(*q) ) {
                return 0;
            }

            q = strchr( q, SEMICOLON );

            if ( !q ) {
                return 0;
            }
            TIXMLASSERT( *q == SEMICOLON );

            delta = q-p;
            --q;

            while ( *q != '#' ) {
                if ( *q >= '0' && *q <= '9' ) {
                    const unsigned int digit = *q - '0';
                    TIXMLASSERT( digit < 10 );
                    TIXMLASSERT( digit == 0 || mult <= UINT_MAX / digit );
                    const unsigned int digitScaled = mult * digit;
                    TIXMLASSERT( ucs <= ULONG_MAX - digitScaled );
                    ucs += digitScaled;
                }
                else {
                    return 0;
                }
                TIXMLASSERT( mult <= UINT_MAX / 10 );
                mult *= 10;
                --q;
            }
        }
        // convert the UCS to UTF-8
        ConvertUTF32ToUTF8( ucs, value, length );
        return p + delta + 1;
    }
    return p+1;
}